

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_CURE(effect_handler_context_t_conflict *context)

{
  byte local_15;
  wchar_t type;
  effect_handler_context_t_conflict *context_local;
  
  local_15 = 1;
  if ((context->origin).what == SRC_PLAYER) {
    local_15 = context->aware ^ 0xff;
  }
  player_clear_timed(player,context->subtype,true,(_Bool)(local_15 & 1));
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_CURE(effect_handler_context_t *context)
{
	int type = context->subtype;
	(void) player_clear_timed(player, type, true,
		context->origin.what != SRC_PLAYER || !context->aware);
	context->ident = true;
	return true;
}